

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  size_t *psVar1;
  ulong value;
  size_t sVar2;
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined4 uVar3;
  undefined2 uVar4;
  type tVar5;
  float value_02;
  string *result;
  char *__src;
  ptrdiff_t _Num;
  ulong __n;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  undefined1 local_248 [8];
  memory_buffer buffer;
  stringifier local_21;
  
  uVar3 = local_248._4_4_;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) && (*(short *)this == 0x7d7b)) {
    if ((long)args_00.desc_ < 0) {
      if (((int)(type)format_str.size_ < 1) ||
         (tVar5 = (args_00.field_1.args_)->type_, tVar5 == none_type)) goto LAB_0022ba43;
    }
    else {
      tVar5 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0022ba43:
        error_handler::on_error((error_handler *)__return_storage_ptr__,"argument not found");
      }
    }
    value = ((args_00.field_1.values_)->field_0).ulong_long_value;
    sVar2 = ((args_00.field_1.values_)->field_0).string.size;
    value_02 = (float)value;
    uVar4 = (undefined2)sVar2;
    local_248._4_4_ = (undefined4)(value >> 0x20);
    switch(tVar5) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,(int)value_02);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,(uint)value_02);
      break;
    case long_long_type:
      to_string<long_long,_0>(__return_storage_ptr__,value);
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>(__return_storage_ptr__,value);
      break;
    case int128_type:
      value_00._4_4_ = uVar3;
      value_00._0_4_ = local_248._0_4_;
      value_00._8_2_ = buffer.super_buffer<char>._vptr_buffer._0_2_;
      value_00._10_6_ = buffer.super_buffer<char>._vptr_buffer._2_6_;
      to_string<__int128,_0>(__return_storage_ptr__,(__int128)value_00);
      break;
    case uint128_type:
      value_01._4_4_ = uVar3;
      value_01._0_4_ = local_248._0_4_;
      value_01._8_2_ = buffer.super_buffer<char>._vptr_buffer._0_2_;
      value_01._10_6_ = buffer.super_buffer<char>._vptr_buffer._2_6_;
      to_string<unsigned___int128,_0>(__return_storage_ptr__,(unsigned___int128)value_01);
      break;
    case bool_type:
      __n = (ulong)((uint)value_02 & 1) ^ 5;
      __src = "false";
      if ((value & 1) != 0) {
        __src = "true";
      }
      memcpy(local_248,__src,__n);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_248,local_248 + __n);
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (char)value;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      local_248._0_4_ = value_02;
      to_string<float,_0>(__return_storage_ptr__,(float *)local_248);
      break;
    case double_type:
      local_248._0_4_ = value_02;
      to_string<double,_0>(__return_storage_ptr__,(double *)local_248);
      break;
    case last_numeric_type:
      local_248._0_4_ = value_02;
      buffer.super_buffer<char>._vptr_buffer._0_2_ = uVar4;
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)local_248);
      break;
    case cstring_type:
      local_248._0_4_ = value_02;
      to_string<const_char_*,_0>(__return_storage_ptr__,(char **)local_248);
      break;
    case string_type:
      buffer.super_buffer<char>._vptr_buffer._2_6_ = (undefined6)(sVar2 >> 0x10);
      local_248._0_4_ = value_02;
      buffer.super_buffer<char>._vptr_buffer._0_2_ = uVar4;
      to_string<fmt::v7::basic_string_view<char>,_0>
                (__return_storage_ptr__,(basic_string_view<char> *)local_248);
      break;
    case pointer_type:
      local_248._0_4_ = value_02;
      to_string<const_void_*,_0>(__return_storage_ptr__,(void **)local_248);
      break;
    case custom_type:
      stringifier::operator()[abi_cxx11_
                (__return_storage_ptr__,&local_21,
                 (handle)((args_00.field_1.values_)->field_0).string);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                  ,0x6d7,"");
    }
  }
  else {
    psVar1 = &buffer.super_buffer<char>.capacity_;
    buffer.super_buffer<char>.ptr_ = (char *)0x0;
    local_248._0_4_ = 3.970394e-39;
    local_248._4_4_ = 0;
    buffer.super_buffer<char>._vptr_buffer._0_2_ = SUB82(psVar1,0);
    buffer.super_buffer<char>._vptr_buffer._2_6_ = (undefined6)((ulong)psVar1 >> 0x10);
    buffer.super_buffer<char>.size_ = 500;
    format_str_00.data_ = (char *)this;
    vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
              ((iterator)local_248,format_str_00,args_00,(locale_ref)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               CONCAT62(buffer.super_buffer<char>._vptr_buffer._2_6_,
                        buffer.super_buffer<char>._vptr_buffer._0_2_),
               buffer.super_buffer<char>.ptr_ +
               CONCAT62(buffer.super_buffer<char>._vptr_buffer._2_6_,
                        buffer.super_buffer<char>._vptr_buffer._0_2_));
    local_248._0_4_ = 3.970394e-39;
    local_248._4_4_ = 0;
    if ((size_t *)
        CONCAT62(buffer.super_buffer<char>._vptr_buffer._2_6_,
                 buffer.super_buffer<char>._vptr_buffer._0_2_) != psVar1) {
      operator_delete((undefined1 *)
                      CONCAT62(buffer.super_buffer<char>._vptr_buffer._2_6_,
                               buffer.super_buffer<char>._vptr_buffer._0_2_),
                      buffer.super_buffer<char>.size_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}